

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-take.c
# Opt level: O3

_Bool borg_flow_take_scum(_Bool viewable,wchar_t nearness)

{
  byte bVar1;
  byte bVar2;
  _Bool _Var3;
  wchar_t wVar4;
  loc_conflict grid2;
  borg_take *pbVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  wchar_t wVar10;
  wchar_t wVar11;
  
  if ((borg_takes_cnt != 0) &&
     (borg_items[(int)(~borg.trait[0x9e] + (uint)z_info->pack_size)].iqty == '\0')) {
    borg_temp_n = 0;
    if (track_less.num < 1) {
      wVar4 = L'\xffffffff';
    }
    else {
      uVar9 = 0xffffffff;
      uVar6 = 0;
      wVar10 = L'\xffffffff';
      do {
        grid2 = loc(track_less.x[uVar6],track_less.y[uVar6]);
        wVar4 = distance(borg.c,grid2);
        wVar11 = wVar10;
        if (wVar10 <= wVar4) {
          wVar11 = wVar4;
        }
        if (wVar10 < wVar4) {
          uVar9 = uVar6 & 0xffffffff;
        }
        wVar4 = (wchar_t)uVar9;
        uVar6 = uVar6 + 1;
        wVar10 = wVar11;
      } while ((long)uVar6 < (long)track_less.num);
    }
    if (1 < borg_takes_nxt) {
      lVar7 = 1;
      lVar8 = 0x28;
      pbVar5 = borg_takes;
      do {
        if ((*(long *)((long)pbVar5 + lVar8 + -0x10) != 0) &&
           (0 < *(int *)((long)&pbVar5->kind + lVar8))) {
          bVar1 = *(byte *)((long)pbVar5 + lVar8 + -4);
          bVar2 = *(byte *)((long)pbVar5 + lVar8 + -3);
          if (((!viewable) || ((borg_grids[bVar2][bVar1].info & 0x20) != 0)) &&
             (_Var3 = borg_flow_far_from_stairs((uint)bVar1,(uint)bVar2,wVar4), pbVar5 = borg_takes,
             !_Var3)) {
            borg_temp_x[borg_temp_n] = bVar1;
            borg_temp_y[borg_temp_n] = bVar2;
            borg_temp_n = borg_temp_n + 1;
          }
        }
        lVar7 = lVar7 + 1;
        lVar8 = lVar8 + 0x18;
      } while (lVar7 < borg_takes_nxt);
    }
    if (borg_temp_n != 0) {
      borg_flow_clear();
      if (0 < borg_temp_n) {
        lVar7 = 0;
        do {
          borg_flow_enqueue_grid((uint)borg_temp_y[lVar7],(uint)borg_temp_x[lVar7]);
          lVar7 = lVar7 + 1;
        } while (lVar7 < borg_temp_n);
      }
      borg_flow_spread(nearness,true,!viewable,false,L'\xffffffff',true);
      _Var3 = borg_flow_commit("Scum item",L'\x02');
      if (_Var3) {
        _Var3 = borg_flow_old(L'\x02');
        return _Var3;
      }
    }
  }
  return false;
}

Assistant:

bool borg_flow_take_scum(bool viewable, int nearness)
{
    int i, x, y;
    int j;
    int b_j     = -1;
    int b_stair = -1;

    borg_grid *ag;

    /* Efficiency -- Nothing to take */
    if (!borg_takes_cnt)
        return false;

    /* Require one empty slot */
    if (borg_items[PACK_SLOTS - 1].iqty)
        return false;

    /* Nothing yet */
    borg_temp_n = 0;

    /* Check distance away from stairs, used later */

    /* Check for an existing "up stairs" */
    for (i = 0; i < track_less.num; i++) {
        x = track_less.x[i];
        y = track_less.y[i];

        /* How far is the nearest up stairs */
        j = distance(borg.c, loc(x, y));

        /* skip the closer ones */
        if (b_j >= j)
            continue;

        /* track it */
        b_j     = j;
        b_stair = i;
    }

    /* Scan the object list -- set filter*/
    for (i = 1; i < borg_takes_nxt; i++) {
        borg_take *take = &borg_takes[i];

        /* Skip dead objects */
        if (!take->kind)
            continue;

        /* Access the location */
        x = take->x;
        y = take->y;

        /* Get the grid */
        ag = &borg_grids[y][x];

        /* skip worthless items */
        if (take->value <= 0)
            continue;

        /* Require line of sight if requested */
        if (viewable && !(ag->info & BORG_VIEW))
            continue;

        /* don't go too far from the stairs */
        if (borg_flow_far_from_stairs(x, y, b_stair))
            continue;

        /* Careful -- Remember it */
        borg_temp_x[borg_temp_n] = x;
        borg_temp_y[borg_temp_n] = y;
        borg_temp_n++;
    }

    /* Nothing to take */
    if (!borg_temp_n)
        return false;

    /* Clear the flow codes */
    borg_flow_clear();

    /* Look for something to take */
    for (i = 0; i < borg_temp_n; i++) {
        /* Enqueue the grid */
        borg_flow_enqueue_grid(borg_temp_y[i], borg_temp_x[i]);
    }

    /* Spread the flow */
    /* if we are not flowing toward items that we can see, make sure they */
    /* are at least easily reachable.  The second flag is weather or not  */
    /* to avoid unknown squares.  This was for performance. */
    borg_flow_spread(nearness, true, !viewable, false, -1, true);

    /* Attempt to Commit the flow */
    if (!borg_flow_commit("Scum item", GOAL_TAKE))
        return false;

    /* Take one step */
    if (!borg_flow_old(GOAL_TAKE))
        return false;

    /* Success */
    return true;
}